

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O3

HRESULT __thiscall Js::SimpleDataCacheWrapper::OpenReadStream(SimpleDataCacheWrapper *this)

{
  HRESULT HVar1;
  
  HVar1 = ReadHeader(this);
  return HVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::OpenReadStream()
    {
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        HRESULT hr = E_FAIL;
        Assert(this->dataCache != nullptr);
        Assert(this->inStream == nullptr);
        IFFAILRET(this->dataCache->GetReadDataStream(&this->inStream));
#endif

        return ReadHeader();
    }